

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_true,_true>::fix_
          (DaTrie<false,_true,_true> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  uint32_t *puVar1;
  pointer pBVar2;
  uint32_t uVar3;
  pointer pBVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                super__Vector_impl_data._M_start;
  while ((uint)(uVar5 >> 2) <= node_pos >> 8) {
    push_block_(this);
    uVar5 = (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  puVar1 = &this->bc_emps_;
  *puVar1 = *puVar1 - 1;
  uVar3 = *puVar1;
  pBVar2 = (blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
           super__Vector_impl_data._M_start + (node_pos >> 8);
  pBVar2->num_emps = pBVar2->num_emps - 1;
  if (uVar3 == 0) {
    this->head_pos_ = 0xffffffff;
  }
  else {
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->head_pos_ == node_pos) {
      this->head_pos_ = *(uint *)(pBVar4 + node_pos) & 0x7fffffff;
    }
    uVar6 = (ulong)pBVar4[node_pos] & 0x7fffffff;
    uVar5 = (ulong)pBVar4[node_pos] >> 0x20 & 0x7fffffff;
    *(int *)(pBVar4 + uVar5) = (int)uVar6;
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[uVar6] = (Bc)((ulong)pBVar4[uVar6] & 0x80000000ffffffff | uVar5 << 0x20);
  }
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + node_pos;
  *pBVar4 = (Bc)((ulong)*pBVar4 | 0x8000000000000000);
  return;
}

Assistant:

void fix_(uint32_t node_pos, std::vector<Block>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (bc_emps_ == 0) {
      head_pos_ = NOT_FOUND;
    } else {
      if (node_pos == head_pos_) {
        head_pos_ = next_(head_pos_);
      }
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
    }
    bc_[node_pos].fix();
  }